

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

void __thiscall
HighsSymmetryDetection::cleanupBacktrack(HighsSymmetryDetection *this,HighsInt cellCreationStackPos)

{
  size_type sVar1;
  reference pvVar2;
  int in_ESI;
  long in_RDI;
  bool bVar3;
  bool in_stack_0000000f;
  HighsInt in_stack_00000010;
  HighsInt in_stack_00000014;
  HighsInt v;
  HighsInt cellEnd;
  HighsInt cellStart;
  HighsInt cell;
  HighsInt stackPos;
  undefined4 local_20;
  value_type in_stack_ffffffffffffffe4;
  HighsInt in_stack_ffffffffffffffe8;
  value_type in_stack_ffffffffffffffec;
  int iVar4;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110));
  iVar4 = (int)sVar1;
  while (iVar4 = iVar4 + -1, in_ESI <= iVar4) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)iVar4);
    local_20 = *pvVar2;
    in_stack_ffffffffffffffe8 =
         getCellStart((HighsSymmetryDetection *)CONCAT44(local_20,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe4);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),
                        (long)in_stack_ffffffffffffffe8);
    in_stack_ffffffffffffffe4 = *pvVar2;
    in_stack_ffffffffffffffec = local_20;
    while( true ) {
      bVar3 = false;
      if (local_20 < in_stack_ffffffffffffffe4) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)local_20);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x98),(long)*pvVar2);
        bVar3 = *pvVar2 == in_stack_ffffffffffffffec;
      }
      if (!bVar3) break;
      updateCellMembership(_v,in_stack_00000014,in_stack_00000010,in_stack_0000000f);
      local_20 = local_20 + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)CONCAT44(in_ESI,iVar4),
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void HighsSymmetryDetection::cleanupBacktrack(HighsInt cellCreationStackPos) {
  // the links have been updated. Even though they might still not be fully
  // compressed the cell starts will all point to the correct cell end and the
  // lookup with path compression will give the correct start
  for (HighsInt stackPos = cellCreationStack.size() - 1;
       stackPos >= cellCreationStackPos; --stackPos) {
    HighsInt cell = cellCreationStack[stackPos];

    HighsInt cellStart = getCellStart(cell);
    HighsInt cellEnd = currentPartitionLinks[cellStart];

    for (HighsInt v = cell;
         v < cellEnd && vertexToCell[currentPartition[v]] == cell; ++v)
      updateCellMembership(v, cellStart, false);
  }

  cellCreationStack.resize(cellCreationStackPos);
}